

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void __thiscall embree::TutorialBenchmark::~TutorialBenchmark(TutorialBenchmark *this)

{
  this->_vptr_TutorialBenchmark = (_func_int **)&PTR_postParseCommandLine_002aaf58;
  std::__cxx11::string::~string((string *)&(this->params).name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->processedCommandLineOptions);
  std::__cxx11::string::~string((string *)&this->inputFile);
  CommandLineParser::~CommandLineParser(&this->commandLineParser);
  return;
}

Assistant:

static bool benchmark(int argc, char** argv) {
    for (int i = 0; i < argc; ++i)
      if (std::string(argv[i]) == "--benchmark")
        return true;
    return false;
  }